

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferQueue::Write(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  long lVar7;
  BufferBlock *__tmp_1;
  BufferBlock *__tmp_2;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  uint uVar12;
  bool bVar13;
  List<cppnet::BufferBlock> from_list;
  uint32_t local_8c;
  List<cppnet::BufferBlock> local_78;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_38;
  
  peVar9 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar9 == (element_type *)0x0) {
    return 0;
  }
  local_8c = len;
  if (len == 0) {
    local_8c = (*(peVar9->super_Buffer)._vptr_Buffer[8])();
    if (local_8c == 0) {
      return 0;
    }
    peVar9 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar9 != (element_type *)0x0) goto LAB_00119da5;
  }
  else {
LAB_00119da5:
    plVar6 = (long *)__dynamic_cast(peVar9,&InnerBuffer::typeinfo,&typeinfo,0);
    if (plVar6 != (long *)0x0) {
      this_00 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      goto LAB_00119e03;
    }
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar6 = (long *)0x0;
LAB_00119e03:
  local_78._size = *(uint32_t *)(plVar6 + 2);
  peVar8 = (element_type *)plVar6[3];
  this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[4];
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
  }
  local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar6[5];
  local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[6];
  if (local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78._tail.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar13 = true;
  if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
    if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
      bVar13 = false;
      p_Var11 = this_01._M_pi;
    }
  }
  local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar8
  ;
  local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this_01._M_pi;
  uVar4 = (*(peVar8->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
  if (!bVar13) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  uVar12 = 0;
  do {
    peVar10 = (this->_buffer_write).
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar10 == (element_type *)0x0) {
      (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
      peVar10 = (this->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var11 = (this->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar10;
      p_Var1 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var11;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        peVar10 = (this->_buffer_write).
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    local_50 = peVar8;
    local_48 = this_01._M_pi;
    uVar5 = (*(peVar10->super_InnerBuffer).super_Buffer._vptr_Buffer[0xd])
                      (peVar10,&local_50,(ulong)uVar4);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    uVar12 = uVar12 + uVar5;
    bVar13 = uVar4 < uVar5;
    uVar4 = uVar4 - uVar5;
    if (bVar13 || uVar4 == 0) {
      peVar10 = (element_type *)plVar6[7];
      if (peVar8 == peVar10) {
        peVar8 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var11 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var11 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (peVar8 == (element_type *)0x0) goto LAB_0011a0d7;
LAB_0011a045:
          lVar7 = 0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
          if (peVar8 == (element_type *)0x0) {
LAB_0011a0d7:
            (**(code **)(*plVar6 + 0x90))(plVar6);
            goto LAB_0011a0e7;
          }
          peVar8 = *(element_type **)(plVar6[7] + 0x20);
          lVar7 = *(long *)(plVar6[7] + 0x28);
          if (lVar7 == 0) goto LAB_0011a045;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar7 + 8) = *(int *)(lVar7 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar7 + 8) = *(int *)(lVar7 + 8) + 1;
          }
        }
        plVar6[7] = (long)peVar8;
        p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[8];
        plVar6[8] = lVar7;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
      }
      List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      _Var3._M_pi = local_78._head.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      peVar8 = local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_78._head.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      uVar4 = (*(peVar8->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(peVar8);
      this_01._M_pi = _Var3._M_pi;
    }
    else {
      if (local_8c <= uVar12) goto LAB_0011a0e7;
      peVar10 = (this->_buffer_write).
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var11 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      p_Var1 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var11;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    if (local_8c <= uVar12) {
LAB_0011a0e7:
      this->_can_read_length = this->_can_read_length + uVar12;
      *(uint *)(plVar6 + 1) = (int)plVar6[1] - uVar12;
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      List<cppnet::BufferBlock>::~List(&local_78);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return uVar12;
    }
  } while( true );
}

Assistant:

uint32_t BufferQueue::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    auto from_list = buffer_queue->_buffer_list;
    auto from_buffer = from_list.GetHead();

    uint32_t should_write_size = from_list.GetHead()->GetCanReadLength();
    uint32_t total_write_len = 0;
    uint32_t cur_write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        cur_write_len = _buffer_write->Write(from_buffer, should_write_size);
        total_write_len += cur_write_len;
        
        // current read block is empty
        if (cur_write_len >= should_write_size) {
            if (from_buffer == buffer_queue->_buffer_write) {
                if (buffer_queue->_buffer_write->GetNext()) {
                    buffer_queue->_buffer_write = buffer_queue->_buffer_write->GetNext();

                } else {
                    buffer_queue->Reset();
                    break;
                }
            }
            from_list.PopFront();
            from_buffer = from_list.GetHead();
            should_write_size = from_buffer->GetCanReadLength();

        // current write block is full
        } else {
            if (total_write_len >= len) {
                break;
            }
            should_write_size -= cur_write_len;
            _buffer_write = _buffer_write->GetNext();
        }

        if (total_write_len >= len) {
            break;
        }
    }
    _can_read_length += total_write_len;
    buffer_queue->_can_read_length -= total_write_len;
    return total_write_len;
}